

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,ArgIface *arg,OutStreamType *to)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pbVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer word;
  anon_class_16_2_51562d2c __f;
  bool makeOffset;
  size_type maxLineLength;
  StringList usage;
  size_type length;
  char local_b9;
  ulong local_b8;
  size_type local_b0;
  long local_a8 [2];
  StringList local_98;
  undefined1 local_80 [32];
  size_type *local_60;
  ulong *local_58;
  HelpPrinter *local_50;
  size_type *local_48;
  StringList local_40;
  size_type local_28;
  
  iVar2 = (*arg->_vptr_ArgIface[5])(arg);
  createUsageString_abi_cxx11_(&local_40,this,arg,SUB41(iVar2,0));
  std::__ostream_insert<char,std::char_traits<char>>(to,"USAGE: ",7);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Args::HelpPrinter::print(Args::ArgIface*,std::ostream&)const::_lambda(std::__cxx11::string_const&)_1_>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_40.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_3fcf6739)to);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  iVar2 = (*arg->_vptr_ArgIface[0xb])(arg);
  local_80._8_8_ = (OutStreamType *)0x0;
  local_80._16_8_ = local_80._16_8_ & 0xffffffffffffff00;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __first._M_current = *(char **)CONCAT44(extraout_var,iVar2);
  __f.result = &local_98;
  __f.word = (String *)local_80;
  local_80._0_8_ = local_80 + 0x10;
  std::
  for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,Args::HelpPrinter::splitToWords(std::__cxx11::string_const&)const::_lambda(char_const&)_1_>
            (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]),__f);
  if ((OutStreamType *)local_80._8_8_ != (OutStreamType *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_98,(value_type *)local_80);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_a8[1] = 0;
  local_a8[0] = 7;
  local_b0 = 7;
  local_b8 = this->m_lineLength - 0xe;
  if (this->m_lineLength < 0xe) {
    local_b8 = 0;
  }
  if (local_b8 < 0x14) {
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n\n",2);
    local_b8 = this->m_lineLength - 0x14;
    local_a8[0] = 0x14;
    local_b0 = 0;
  }
  pbVar1 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8[1] = 0;
  local_60 = &local_28;
  local_28 = 0;
  local_80._16_8_ = local_a8 + 1;
  local_80._24_8_ = local_a8;
  local_b9 = local_a8[0] != 0;
  local_80._0_8_ = &local_b9;
  local_58 = &local_b8;
  local_48 = &local_b0;
  local_80._8_8_ = to;
  local_50 = this;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    word = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      printString::anon_class_64_8_a3d8de13::operator()((anon_class_64_8_a3d8de13 *)local_80,word);
      word = word + 1;
    } while (word != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

inline void
HelpPrinter::print( ArgIface * arg, OutStreamType & to ) const
{
	StringList usage = createUsageString( arg,
		arg->isRequired() );

	to << "USAGE: ";

	std::for_each( usage.cbegin(), usage.cend(),
		[ & ] ( const String & s )
			{ to << s << ' '; }
	);

	to << "\n" << "\n";

	printString( to, splitToWords( arg->longDescription() ),
		0, 7, 7 );

	to << "\n" << "\n";

	to.flush();
}